

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resourcemanager.cpp
# Opt level: O3

GLuint __thiscall
ResourceManager::getShader(ResourceManager *this,string *vtShader,string *fragShader,bool *succes)

{
  pointer pcVar1;
  long *plVar2;
  iterator iVar3;
  size_type *psVar4;
  _Rb_tree_color _Var5;
  size_type *local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string shaderKey;
  
  pcVar1 = (vtShader->_M_dataplus)._M_p;
  local_70 = &__str._M_string_length;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + vtShader->_M_string_length);
  std::__cxx11::string::append((char *)&local_70);
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_70,(ulong)(fragShader->_M_dataplus)._M_p);
  psVar4 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar4) {
    shaderKey._M_string_length = *psVar4;
    shaderKey.field_2._M_allocated_capacity = plVar2[3];
    __str.field_2._8_8_ = &shaderKey._M_string_length;
  }
  else {
    shaderKey._M_string_length = *psVar4;
    __str.field_2._8_8_ = (size_type *)*plVar2;
  }
  shaderKey._M_dataplus._M_p = (pointer)plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_70 != &__str._M_string_length) {
    operator_delete(local_70);
  }
  *succes = false;
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
          ::find(&(this->loadedShaders)._M_t,(key_type *)((long)&__str.field_2 + 8));
  if ((_Rb_tree_header *)iVar3._M_node == &(this->loadedShaders)._M_t._M_impl.super__Rb_tree_header)
  {
    _Var5 = ~_S_red;
  }
  else {
    *succes = true;
    _Var5 = iVar3._M_node[2]._M_color;
  }
  if ((size_type *)__str.field_2._8_8_ != &shaderKey._M_string_length) {
    operator_delete((void *)__str.field_2._8_8_);
  }
  return _Var5;
}

Assistant:

GLuint ResourceManager::getShader(std::string vtShader, std::string fragShader, bool& succes)
{
	std::string shaderKey = vtShader + "," + fragShader;
	succes = false;
	std::map<std::string, GLuint>::iterator it;
	it = loadedShaders.find(shaderKey);
	if (it == loadedShaders.end())
	{
		return -1;
	}
	else
	{
		succes = true;
		return it->second;
	}
}